

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproxy.cpp
# Opt level: O0

void issue_sleep_checks(void)

{
  uint uVar1;
  uchar uVar2;
  size_type sVar3;
  reference pvVar4;
  uint i;
  arp_ipv4 *arp_req_arp;
  LinuxRawSocket query_socket;
  LinuxRawSocket *in_stack_ffffffffffffff40;
  LinuxRawSocket *in_stack_ffffffffffffff48;
  LinuxRawSocket *pLVar5;
  uint local_9c;
  LinuxRawSocket *local_98;
  LinuxRawSocket local_80;
  
  LinuxRawSocket::LinuxRawSocket(in_stack_ffffffffffffff40);
  LinuxRawSocket::setOutputInterface(in_stack_ffffffffffffff48,(string *)in_stack_ffffffffffffff40);
  local_98 = (LinuxRawSocket *)(arp_request + 0xe);
  local_9c = 0;
  while( true ) {
    sVar3 = std::vector<Device,_std::allocator<Device>_>::size(&devices);
    if (sVar3 <= local_9c) break;
    pvVar4 = std::vector<Device,_std::allocator<Device>_>::operator[](&devices,(ulong)local_9c);
    pvVar4->is_awake = false;
    in_stack_ffffffffffffff40 = local_98;
    pvVar4 = std::vector<Device,_std::allocator<Device>_>::operator[](&devices,(ulong)local_9c);
    uVar2 = pvVar4->mac_address[5];
    (in_stack_ffffffffffffff40->input_interface).sll_pkttype = pvVar4->mac_address[4];
    (in_stack_ffffffffffffff40->input_interface).sll_halen = uVar2;
    *(undefined4 *)((long)&(in_stack_ffffffffffffff40->input_interface).sll_ifindex + 2) =
         *(undefined4 *)pvVar4->mac_address;
    pLVar5 = local_98;
    pvVar4 = std::vector<Device,_std::allocator<Device>_>::operator[](&devices,(ulong)local_9c);
    uVar1 = *(uint *)pvVar4->ip_address;
    *(uint *)(pLVar5->input_interface).sll_addr = uVar1;
    LinuxRawSocket::write(&local_80,0x1143f0,(void *)0x2a,(ulong)uVar1);
    local_9c = local_9c + 1;
  }
  LinuxRawSocket::~LinuxRawSocket(in_stack_ffffffffffffff40);
  return;
}

Assistant:

void issue_sleep_checks()
{
  // Create a socket to issue requests
  LinuxRawSocket query_socket;
  query_socket.setOutputInterface(interface_name);

  // Get a pointer to the ARP section of the request
  arp_ipv4* arp_req_arp =
    (arp_ipv4*)(arp_request + sizeof(ethernet_ii_header));

  // ARP request to all devices
  for(unsigned int i = 0; i < devices.size(); i++)
  {
    // Mark the device as not awake; if it really is awake, the other thread
    // will receive a response to the coming ARP request and mark it as such
    devices[i].is_awake = false;

    // Update buffer with current device's IP and MAC
    memcpy(arp_req_arp->tha, devices[i].mac_address, 6);
    memcpy(arp_req_arp->tpa, devices[i].ip_address,  4);

    // Issue the request
    query_socket.write((const char*)arp_request,
                       sizeof(ethernet_ii_header) + sizeof(arp_ipv4));
  }
}